

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

vec6F * __thiscall
crnlib::dxt_hc::palettize_color
          (vec6F *__return_storage_ptr__,dxt_hc *this,color_quad_u8 *pixels,uint pixels_count)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint size;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  vec3F result [2];
  uint color [64];
  uint weights [64];
  vec3F vectors [64];
  undefined1 local_538 [28];
  uint uStack_51c;
  uint local_518 [64];
  uint local_418 [64];
  vec<3U,_float> local_318 [64];
  
  uVar4 = (ulong)pixels_count;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(uint *)((long)local_518 + uVar3 * 4) =
         (uint)pixels[uVar3].field_0.field_0.b |
         (uint)pixels[uVar3].field_0.field_0.g << 8 | (uint)pixels[uVar3].field_0.field_0.r << 0x10;
  }
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
            (local_518,(long)local_518 + uVar4 * 4);
  bVar1 = (this->m_params).m_perceptual;
  size = 0;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    if ((uVar3 == 0) || (*(uint *)((long)local_518 + uVar3 * 4) != (&uStack_51c)[uVar3])) {
      uVar2 = *(uint *)((long)local_518 + uVar3 * 4);
      bVar5 = (bVar1 & 1U) == 0;
      fVar6 = this->m_uint8_to_float[uVar2 >> 0x10] * 0.5;
      if (bVar5) {
        fVar6 = this->m_uint8_to_float[uVar2 >> 0x10];
      }
      local_318[size].m_s[0] = fVar6;
      local_318[size].m_s[1] = this->m_uint8_to_float[uVar2 >> 8 & 0xff];
      fVar6 = this->m_uint8_to_float[uVar2 & 0xff] * 0.25;
      if (bVar5) {
        fVar6 = this->m_uint8_to_float[uVar2 & 0xff];
      }
      local_318[size].m_s[2] = fVar6;
      local_418[size] = 1;
      size = size + 1;
    }
    else {
      local_418[size - 1] = local_418[size - 1] + 1;
    }
  }
  split_vectors<crnlib::vec<3u,float>>(&local_318,&local_418,size,(vec<3U,_float> (*) [2])local_538)
  ;
  fVar6 = vec<3U,_float>::length((vec<3U,_float> *)local_538);
  fVar7 = vec<3U,_float>::length((vec<3U,_float> *)(local_538 + 0xc));
  if (fVar7 < fVar6) {
    utils::swap<crnlib::vec<3u,float>>
              ((vec<3U,_float> *)local_538,(vec<3U,_float> *)(local_538 + 0xc));
  }
  vec<6U,_float>::vec(__return_storage_ptr__,(vec<6U,_float> *)local_538);
  return __return_storage_ptr__;
}

Assistant:

vec6F dxt_hc::palettize_color(color_quad_u8* pixels, uint pixels_count) {
  uint color[64];
  for (uint i = 0; i < pixels_count; i++)
    color[i] = pixels[i][0] << 16 | pixels[i][1] << 8 | pixels[i][2];
  std::sort(color, color + pixels_count);
  vec3F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || color[i] != color[i - 1]) {
      vectors[size][0] = m_params.m_perceptual ? m_uint8_to_float[color[i] >> 16] * 0.5f : m_uint8_to_float[color[i] >> 16];
      vectors[size][1] = m_uint8_to_float[color[i] >> 8 & 0xFF];
      vectors[size][2] = m_params.m_perceptual ? m_uint8_to_float[color[i] & 0xFF] * 0.25f : m_uint8_to_float[color[i] & 0xFF];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec3F result[2];
  split_vectors<vec3F>(vectors, weights, size, result);
  if (result[0].length() > result[1].length())
    utils::swap(result[0], result[1]);
  return *(vec6F*)result;
}